

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_reader_locate_file_v2
                  (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  mz_uint32 mVar5;
  mz_zip_internal_state *pmVar6;
  void *pvVar7;
  bool bVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  byte *pbVar23;
  uint uVar24;
  long lVar25;
  void *pvVar26;
  ulong uVar27;
  byte *pbVar28;
  bool bVar29;
  size_t local_78;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar6 = pZip->m_pState;
  if (pName == (char *)0x0 || pmVar6 == (mz_zip_internal_state *)0x0) {
LAB_001177a5:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((((pmVar6->m_init_flags & 0x800) == 0) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
     (pComment == (char *)0x0 && (flags & 0x300) == 0)) {
    if ((pmVar6->m_sorted_central_dir_offsets).m_size != 0) {
      pvVar7 = (pmVar6->m_sorted_central_dir_offsets).m_p;
      uVar15 = pZip->m_total_files;
      sVar11 = strlen(pName);
      if (pIndex != (mz_uint32 *)0x0) {
        *pIndex = 0;
      }
      if ((ulong)uVar15 != 0) {
        pvVar26 = (pmVar6->m_central_dir).m_p;
        lVar25 = (ulong)uVar15 - 1;
        lVar18 = 0;
        do {
          uVar20 = (lVar25 - lVar18 >> 1) + lVar18;
          uVar15 = *(uint *)((long)pvVar7 + (uVar20 & 0xffffffff) * 4);
          if (((pmVar6->m_central_dir_offsets).m_size <= (ulong)uVar15) ||
             (uVar22 = (ulong)*(uint *)((long)(pmVar6->m_central_dir_offsets).m_p +
                                       (ulong)uVar15 * 4), (pmVar6->m_central_dir).m_size <= uVar22)
             ) goto LAB_00117bdd;
          pbVar23 = (byte *)((long)pvVar26 + uVar22 + 0x2e);
          uVar4 = *(ushort *)(pbVar23 + -0x12);
          uVar27 = (ulong)uVar4;
          if ((uint)sVar11 <= (uint)uVar4) {
            uVar27 = sVar11 & 0xffffffff;
          }
          pbVar1 = (byte *)((long)pvVar26 + uVar27 + 0x2e + uVar22);
          pbVar28 = (byte *)pName;
          if ((int)uVar27 == 0) {
            iVar10 = 0;
          }
          else {
            do {
              bVar3 = *pbVar23;
              bVar2 = *pbVar28;
              uVar17 = bVar3 + 0x20 & 0xff;
              if (0x19 < (byte)(bVar3 + 0xbf)) {
                uVar17 = (uint)bVar3;
              }
              uVar24 = bVar2 + 0x20 & 0xff;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                uVar24 = (uint)bVar2;
              }
              if ((char)uVar17 != (char)uVar24) break;
              pbVar23 = pbVar23 + 1;
              pbVar28 = pbVar28 + 1;
              uVar24 = uVar17;
            } while (pbVar23 < pbVar1);
            iVar10 = uVar17 - uVar24;
          }
          if (pbVar23 == pbVar1) {
            iVar10 = (uint)uVar4 - (uint)sVar11;
          }
          if (iVar10 == 0) {
            if (pIndex != (mz_uint32 *)0x0) {
              *pIndex = uVar15;
              return 1;
            }
            return 1;
          }
          lVar9 = uVar20 - 1;
          if (iVar10 < 0) {
            lVar18 = uVar20 + 1;
            lVar9 = lVar25;
          }
          lVar25 = lVar9;
        } while (lVar18 <= lVar25);
      }
      pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
      return 0;
    }
    sVar11 = strlen(pName);
    if (0xffff < sVar11) goto LAB_001177a5;
  }
  else {
    sVar11 = strlen(pName);
    if (0xffff < sVar11) goto LAB_001177a5;
    if (pComment != (char *)0x0) {
      local_78 = strlen(pComment);
      if (0xffff < local_78) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
        return 0;
      }
      goto LAB_00117976;
    }
  }
  local_78 = 0;
LAB_00117976:
  mVar5 = pZip->m_total_files;
  if (mVar5 != 0) {
    pvVar7 = (pmVar6->m_central_dir).m_p;
    uVar20 = (pmVar6->m_central_dir_offsets).m_size;
    uVar22 = 0;
    do {
      if ((uVar20 <= uVar22) ||
         (uVar27 = (ulong)*(uint *)((long)(pmVar6->m_central_dir_offsets).m_p + uVar22 * 4),
         (pmVar6->m_central_dir).m_size <= uVar27)) {
LAB_00117bdd:
        __assert_fail("index < pArray->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/test/../Zippy/library/Zippy/miniz/miniz.h"
                      ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
      }
      uVar4 = *(ushort *)((long)pvVar7 + uVar27 + 0x1c);
      uVar13 = (ulong)uVar4;
      if (sVar11 <= uVar13) {
        pvVar26 = (void *)((long)pvVar7 + uVar27 + 0x2e);
        if (local_78 == 0) goto LAB_00117ab2;
        uVar12 = (ulong)*(ushort *)((long)pvVar7 + uVar27 + 0x20);
        if (local_78 != uVar12) goto LAB_00117b90;
        uVar19 = (ulong)*(ushort *)((long)pvVar7 + uVar27 + 0x1e);
        if ((flags >> 8 & 1) == 0) {
          uVar16 = 0;
          do {
            bVar3 = pComment[uVar16];
            iVar10 = bVar3 + 0x20;
            if (0x19 < (byte)(bVar3 + 0xbf)) {
              iVar10 = (int)(char)bVar3;
            }
            bVar3 = *(byte *)((long)pvVar7 + uVar16 + uVar19 + uVar27 + uVar13 + 0x2e);
            iVar21 = bVar3 + 0x20;
            if (0x19 < (byte)(bVar3 + 0xbf)) {
              iVar21 = (int)(char)bVar3;
            }
            if (iVar10 != iVar21) goto LAB_00117b90;
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
LAB_00117ab2:
          if (((flags >> 9 & 1) != 0) && (uVar4 != 0)) {
            do {
              uVar15 = *(byte *)((long)pvVar7 + uVar13 + uVar27 + 0x2d) - 0x2f;
              if ((uVar15 < 0x2e) && ((0x200000000801U >> ((ulong)uVar15 & 0x3f) & 1) != 0))
              goto LAB_00117af3;
              bVar8 = 1 < (long)uVar13;
              uVar13 = uVar13 - 1;
            } while (bVar8);
            uVar13 = 0;
LAB_00117af3:
            pvVar26 = (void *)((long)pvVar26 + (uVar13 & 0xffffffff));
            uVar13 = (ulong)((uint)uVar4 - (int)uVar13);
          }
          if (sVar11 != uVar13) goto LAB_00117b90;
          if ((flags >> 8 & 1) == 0) {
            if ((int)uVar13 != 0) {
              sVar14 = 0;
              do {
                bVar3 = pName[sVar14];
                iVar10 = bVar3 + 0x20;
                if (0x19 < (byte)(bVar3 + 0xbf)) {
                  iVar10 = (int)(char)bVar3;
                }
                bVar3 = *(byte *)((long)pvVar26 + sVar14);
                iVar21 = bVar3 + 0x20;
                if (0x19 < (byte)(bVar3 + 0xbf)) {
                  iVar21 = (int)(char)bVar3;
                }
                if (iVar10 != iVar21) goto LAB_00117b90;
                sVar14 = sVar14 + 1;
              } while (sVar11 != sVar14);
            }
            bVar29 = false;
          }
          else {
            iVar10 = bcmp(pName,pvVar26,sVar11);
            bVar29 = iVar10 != 0;
          }
          bVar8 = (bool)(bVar29 ^ 1);
          if ((pIndex != (mz_uint32 *)0x0) && (!bVar29)) {
            *pIndex = (mz_uint32)uVar22;
            return 1;
          }
        }
        else {
          iVar10 = bcmp(pComment,(void *)((long)pvVar26 + uVar13 + uVar19),local_78);
          bVar8 = false;
          if (iVar10 == 0) goto LAB_00117ab2;
        }
        if (bVar8) {
          return 1;
        }
      }
LAB_00117b90:
      uVar15 = (mz_uint32)uVar22 + 1;
      uVar22 = (ulong)uVar15;
    } while (uVar15 != mVar5);
  }
  pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
  return 0;
}

Assistant:

inline mz_bool
mz_zip_reader_locate_file_v2(mz_zip_archive* pZip, const char* pName, const char* pComment, mz_uint flags,
                             mz_uint32* pIndex) {

    mz_uint file_index;
    size_t name_len, comment_len;

    if (pIndex)
        *pIndex = 0;

    if ((!pZip) || (!pZip->m_pState) || (!pName))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* See if we can use a binary search */
    if (((pZip->m_pState->m_init_flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0)
            && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)
            && ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment)
            && (pZip->m_pState->m_sorted_central_dir_offsets.m_size)) {
        return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
    }

    /* Locate the entry by scanning the entire central directory */
    name_len = strlen(pName);
    if (name_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    comment_len = pComment ? strlen(pComment) : 0;
    if (comment_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
        const mz_uint8* pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir,
                                                        mz_uint8,
                                                        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                                                             mz_uint32,
                                                                             file_index));
        mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
        const char* pFilename = (const char*)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
        if (filename_len < name_len)
            continue;
        if (comment_len) {
            mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(
                    pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
            const char* pFile_comment = pFilename + filename_len + file_extra_len;
            if ((file_comment_len != comment_len)
                    || (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len, flags)))
                continue;
        }
        if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
            int ofs = filename_len - 1;
            do {
                if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
                    break;
            } while (--ofs >= 0);
            ofs++;
            pFilename += ofs;
            filename_len -= ofs;
        }
        if ((filename_len == name_len) && (mz_zip_string_equal(pName, pFilename, filename_len, flags))) {
            if (pIndex)
                *pIndex = file_index;
            return MZ_TRUE;
        }
    }

    return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}